

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-error.c
# Opt level: O1

int run_test_pipe_connect_bad_name(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  int iVar3;
  long *plVar4;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_connect_t req;
  uv_pipe_t client;
  void *pvStack_c68;
  undefined1 auStack_c60 [112];
  uv_pipe_t uStack_bf0;
  char acStack_b08 [2047];
  undefined1 uStack_309;
  uv_loop_t *puStack_308;
  undefined8 uStack_2f8;
  code *pcStack_2f0;
  long lStack_2e8;
  long lStack_2e0;
  uv_connect_t uStack_2d8;
  uv_pipe_t uStack_270;
  uv_loop_t *puStack_188;
  undefined8 uStack_178;
  code *pcStack_170;
  long local_168;
  long local_160;
  uv_connect_t local_158;
  uv_pipe_t local_f0;
  
  plVar4 = &local_168;
  pcStack_170 = (code *)0x1ad411;
  puVar2 = uv_default_loop();
  pcStack_170 = (code *)0x1ad420;
  iVar1 = uv_pipe_init(puVar2,&local_f0,0);
  local_158.data = (void *)(long)iVar1;
  local_168 = 0;
  if (local_158.data == (void *)0x0) {
    pcStack_170 = (code *)0x1ad45b;
    uv_pipe_connect(&local_158,&local_f0,"/path/to/unix/socket/that/really/should/not/be/there",
                    connect_cb);
    pcStack_170 = (code *)0x1ad460;
    puVar2 = uv_default_loop();
    pcStack_170 = (code *)0x1ad46a;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_168 = 1;
    local_160 = (long)close_cb_called;
    if (local_160 != 1) goto LAB_001ad513;
    local_168 = 1;
    local_160 = (long)connect_cb_called;
    if (local_160 != 1) goto LAB_001ad520;
    pcStack_170 = (code *)0x1ad4b1;
    unaff_RBX = uv_default_loop();
    pcStack_170 = (code *)0x1ad4c5;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_170 = (code *)0x1ad4cf;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_168 = 0;
    pcStack_170 = (code *)0x1ad4dc;
    puVar2 = uv_default_loop();
    pcStack_170 = (code *)0x1ad4e4;
    iVar1 = uv_loop_close(puVar2);
    local_160 = (long)iVar1;
    if (local_168 == local_160) {
      pcStack_170 = (code *)0x1ad4fb;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_170 = (code *)0x1ad513;
    run_test_pipe_connect_bad_name_cold_1();
LAB_001ad513:
    pcStack_170 = (code *)0x1ad520;
    run_test_pipe_connect_bad_name_cold_2();
LAB_001ad520:
    pcStack_170 = (code *)0x1ad52d;
    run_test_pipe_connect_bad_name_cold_3();
  }
  iVar1 = (int)&local_160;
  pcStack_170 = connect_cb;
  run_test_pipe_connect_bad_name_cold_4();
  pcStack_170 = (code *)(long)iVar1;
  uStack_178 = 0xfffffffffffffffe;
  if (pcStack_170 == (code *)0xfffffffffffffffe) {
    puStack_188 = (uv_loop_t *)0x1ad56b;
    uv_close(*(uv_handle_t **)((long)plVar4 + 0x50),close_cb);
    connect_cb_called = connect_cb_called + 1;
    return extraout_EAX;
  }
  puStack_188 = (uv_loop_t *)run_test_pipe_connect_to_file;
  connect_cb_cold_1();
  plVar4 = &lStack_2e8;
  pcStack_2f0 = (code *)0x1ad592;
  puStack_188 = unaff_RBX;
  puVar2 = uv_default_loop();
  pcStack_2f0 = (code *)0x1ad5a1;
  iVar1 = uv_pipe_init(puVar2,&uStack_270,0);
  uStack_2d8.data = (void *)(long)iVar1;
  lStack_2e8 = 0;
  if (uStack_2d8.data == (void *)0x0) {
    pcStack_2f0 = (code *)0x1ad5dc;
    uv_pipe_connect(&uStack_2d8,&uStack_270,"test/fixtures/empty_file",connect_cb_file);
    pcStack_2f0 = (code *)0x1ad5e1;
    puVar2 = uv_default_loop();
    pcStack_2f0 = (code *)0x1ad5eb;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_2e8 = 1;
    lStack_2e0 = (long)close_cb_called;
    if (lStack_2e0 != 1) goto LAB_001ad694;
    lStack_2e8 = 1;
    lStack_2e0 = (long)connect_cb_called;
    if (lStack_2e0 != 1) goto LAB_001ad6a1;
    pcStack_2f0 = (code *)0x1ad632;
    unaff_RBX = uv_default_loop();
    pcStack_2f0 = (code *)0x1ad646;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_2f0 = (code *)0x1ad650;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_2e8 = 0;
    pcStack_2f0 = (code *)0x1ad65d;
    puVar2 = uv_default_loop();
    pcStack_2f0 = (code *)0x1ad665;
    iVar1 = uv_loop_close(puVar2);
    lStack_2e0 = (long)iVar1;
    if (lStack_2e8 == lStack_2e0) {
      pcStack_2f0 = (code *)0x1ad67c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_2f0 = (code *)0x1ad694;
    run_test_pipe_connect_to_file_cold_1();
LAB_001ad694:
    pcStack_2f0 = (code *)0x1ad6a1;
    run_test_pipe_connect_to_file_cold_2();
LAB_001ad6a1:
    pcStack_2f0 = (code *)0x1ad6ae;
    run_test_pipe_connect_to_file_cold_3();
  }
  iVar1 = (int)&lStack_2e0;
  pcStack_2f0 = connect_cb_file;
  run_test_pipe_connect_to_file_cold_4();
  if ((iVar1 == -0x58) || (iVar1 == -0xd)) {
LAB_001ad6e6:
    puStack_308 = (uv_loop_t *)0x1ad6f6;
    uv_close(*(uv_handle_t **)((long)plVar4 + 0x50),close_cb);
    connect_cb_called = connect_cb_called + 1;
    return extraout_EAX_00;
  }
  pcStack_2f0 = (code *)(long)iVar1;
  uStack_2f8 = 0xffffffffffffff91;
  if (pcStack_2f0 == (code *)0xffffffffffffff91) goto LAB_001ad6e6;
  puStack_308 = (uv_loop_t *)run_test_pipe_connect_to_long_path;
  connect_cb_file_cold_1();
  iVar3 = (int)&pvStack_c68;
  puStack_308 = unaff_RBX;
  memset(acStack_b08,0x2e,0x7ff);
  uStack_309 = 0;
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&uStack_bf0,0);
  if (iVar1 == 0) {
    uv_pipe_connect((uv_connect_t *)(auStack_c60 + 8),&uStack_bf0,acStack_b08,connect_cb_long_path);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_001ad7f3;
    if (connect_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_c60._0_8_ = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      pvStack_c68 = (void *)(long)iVar1;
      if ((void *)auStack_c60._0_8_ == pvStack_c68) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ad7fd;
    }
  }
  else {
    run_test_pipe_connect_to_long_path_cold_1();
LAB_001ad7f3:
    run_test_pipe_connect_to_long_path_cold_2();
  }
  run_test_pipe_connect_to_long_path_cold_3();
LAB_001ad7fd:
  handle = (uv_handle_t *)auStack_c60;
  run_test_pipe_connect_to_long_path_cold_4();
  if (iVar3 == -0x24) {
    uv_close(*(uv_handle_t **)&handle[1].type,close_cb);
    connect_cb_called = connect_cb_called + 1;
    return extraout_EAX_01;
  }
  connect_cb_long_path_cold_1();
  if (handle != (uv_handle_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_02;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(pipe_connect_bad_name) {
  uv_pipe_t client;
  uv_connect_t req;
  int r;

  r = uv_pipe_init(uv_default_loop(), &client, 0);
  ASSERT_OK(r);
  uv_pipe_connect(&req, &client, BAD_PIPENAME, connect_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);
  ASSERT_EQ(1, connect_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}